

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_info.c
# Opt level: O3

MPP_RET hal_info_from_enc_cfg(HalInfo ctx,MppEncCfgSet *cfg)

{
  uint in_EAX;
  RK_S32 RVar1;
  RK_U64 RVar2;
  RK_U32 profile;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  hal_info_set(ctx,1,1,(long)(cfg->prep).width);
  hal_info_set(ctx,2,1,(long)(cfg->prep).height);
  RVar2 = hal_info_to_string(ctx,3,(void *)((long)ctx + 4));
  hal_info_set(ctx,3,2,RVar2);
  hal_info_set(ctx,4,1,(long)((cfg->rc).fps_in_num / (cfg->rc).fps_in_denom));
  hal_info_set(ctx,5,1,(long)((cfg->rc).fps_out_num / (cfg->rc).fps_out_denom));
  RVar2 = hal_info_to_string(ctx,6,&(cfg->rc).rc_mode);
  hal_info_set(ctx,6,2,RVar2);
  hal_info_set(ctx,7,1,(long)(cfg->rc).bps_target);
  hal_info_set(ctx,8,1,(long)(cfg->rc).gop);
  if (*(int *)((long)ctx + 4) == 0x1000004) {
    RVar1 = (cfg->codec).field_1.h264.stream_type;
  }
  else {
    if (*(int *)((long)ctx + 4) != 7) goto LAB_00264faa;
    RVar1 = (cfg->codec).field_1.h264.profile;
  }
  uStack_18 = CONCAT44(RVar1,(undefined4)uStack_18);
LAB_00264faa:
  RVar2 = hal_info_to_string(ctx,10,(void *)((long)&uStack_18 + 4));
  hal_info_set(ctx,10,2,RVar2);
  return MPP_OK;
}

Assistant:

MPP_RET hal_info_from_enc_cfg(HalInfo ctx, MppEncCfgSet *cfg)
{
    MppEncRcCfg *rc = &cfg->rc;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncCodecCfg *codec = &cfg->codec;
    HalInfoImpl *info = (HalInfoImpl *)ctx;
    RK_U32 profile = 0;
    RK_U64 val = 0;

    hal_info_set(ctx, ENC_INFO_WIDTH, CODEC_INFO_FLAG_NUMBER, prep->width);
    hal_info_set(ctx, ENC_INFO_HEIGHT, CODEC_INFO_FLAG_NUMBER, prep->height);

    val = hal_info_to_string(ctx, ENC_INFO_FORMAT, &info->coding);

    hal_info_set(ctx, ENC_INFO_FORMAT, CODEC_INFO_FLAG_STRING, val);
    hal_info_set(ctx, ENC_INFO_FPS_IN, CODEC_INFO_FLAG_NUMBER,
                 rc->fps_in_num / rc->fps_in_denom);
    hal_info_set(ctx, ENC_INFO_FPS_OUT, CODEC_INFO_FLAG_NUMBER,
                 rc->fps_out_num / rc->fps_out_denom);

    val = hal_info_to_string(ctx, ENC_INFO_RC_MODE, &rc->rc_mode);
    hal_info_set(ctx, ENC_INFO_RC_MODE, CODEC_INFO_FLAG_STRING, val);

    hal_info_set(ctx, ENC_INFO_BITRATE, CODEC_INFO_FLAG_NUMBER, rc->bps_target);
    hal_info_set(ctx, ENC_INFO_GOP_SIZE, CODEC_INFO_FLAG_NUMBER, rc->gop);

    switch (info->coding) {
    case MPP_VIDEO_CodingAVC : {
        profile = codec->h264.profile;
    } break;
    case MPP_VIDEO_CodingHEVC : {
        profile = codec->h265.profile;
    } break;
    case MPP_VIDEO_CodingMJPEG :
    case MPP_VIDEO_CodingVP8 :
    default : {
    } break;
    }
    val = hal_info_to_string(ctx, ENC_INFO_PROFILE, &profile);
    hal_info_set(ctx, ENC_INFO_PROFILE, CODEC_INFO_FLAG_STRING, val);

    return MPP_OK;
}